

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

extent_t *
extents_alloc(tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extents_t *extents,
             void *new_addr,size_t size,size_t pad,size_t alignment,_Bool slab,szind_t szind,
             _Bool *zero,_Bool *commit)

{
  byte *pbVar1;
  bitmap_t *bitmap;
  arena_t *paVar2;
  long lVar3;
  _Bool _Var4;
  extent_split_interior_result_t eVar5;
  arena_t *paVar6;
  size_t sVar7;
  ulong uVar8;
  arena_t *paVar9;
  arena_t *arena_00;
  byte bVar10;
  uint uVar11;
  arena_t *paVar12;
  rtree_ctx_t *prVar13;
  arena_t *extraout_RDX;
  size_t extraout_RDX_00;
  arena_t *extraout_RDX_01;
  arena_t *extraout_RDX_02;
  arena_t *extraout_RDX_03;
  arena_t *extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t sVar14;
  arena_t *paVar15;
  arena_t *paVar16;
  bitmap_info_t *pbVar17;
  int iVar18;
  undefined1 growing_retained;
  extents_t **lead;
  ulong uVar19;
  ulong uVar20;
  void *addr;
  undefined1 growing_retained_00;
  szind_t in_stack_fffffffffffffdd8;
  rtree_ctx_t *prStack_208;
  extent_t *peStack_1d8;
  extent_t *peStack_1d0;
  extents_t *peStack_1c8;
  extents_t *peStack_1c0;
  arena_t *paStack_1b8;
  rtree_ctx_t rStack_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    prStack_208 = &rStack_1b0;
    paVar12 = (arena_t *)extents;
    rtree_ctx_data_init(prStack_208);
  }
  else {
    paVar12 = (arena_t *)
              &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    prStack_208 = (rtree_ctx_t *)paVar12;
  }
  paVar2 = (arena_t *)(pad + size);
  malloc_mutex_lock(tsdn,&extents->mtx);
  extent_hooks_assure_initialized(arena,r_extent_hooks);
  if (new_addr == (void *)0x0) {
    uVar19 = alignment + 0xfff & 0xfffffffffffff000;
    paVar6 = (arena_t *)((long)paVar2 + (uVar19 - 0x1000));
    paVar16 = (arena_t *)extents;
    if (paVar6 < paVar2) {
      paVar6 = (arena_t *)0x0;
      paVar9 = (arena_t *)extents;
      goto LAB_00122b1b;
    }
    sVar7 = extent_size_quantize_ceil((size_t)paVar6);
    if (sVar7 < 0x7000000000000001) {
      uVar8 = sVar7 * 2 - 1;
      sVar14 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> sVar14 == 0; sVar14 = sVar14 - 1) {
        }
      }
      uVar11 = (uint)sVar14;
      iVar18 = uVar11 - 0xe;
      if (uVar11 < 0xe) {
        iVar18 = 0;
      }
      paVar12 = (arena_t *)(ulong)(uVar11 - 3);
      if (uVar11 < 0xf) {
        paVar12 = (arena_t *)0xc;
      }
      bVar10 = (byte)paVar12;
      pbVar17 = (bitmap_info_t *)
                (ulong)(((uint)(((sVar7 - 1 >> (bVar10 & 0x3f)) << (bVar10 & 0x3f)) >>
                               (bVar10 & 0x3f)) & 3) + iVar18 * 4);
    }
    else {
      pbVar17 = (bitmap_info_t *)0xc7;
      sVar14 = extraout_RDX_00;
    }
    bitmap = extents->bitmap;
    uVar8 = bitmap_ffu(bitmap,pbVar17,sVar14);
    arena_00 = (arena_t *)0x0;
    paVar15 = extraout_RDX_01;
    while (uVar20 = uVar8 & 0xffffffff, uVar20 < 200) {
      paVar9 = (arena_t *)extent_heap_first(extents->heaps + uVar20);
      paVar15 = extraout_RDX_02;
      if (((*(char *)((long)&(paVar16->stats).lstats[0x57].nfills.repr + 4) != '\x01') ||
          (paVar12 = (arena_t *)CONCAT71(0x156a,(byte)opt_lg_extent_max_active_fit),
          (arena_t *)(sz_pind2sz_tab[uVar20] >> ((byte)opt_lg_extent_max_active_fit & 0x3f)) <=
          paVar6)) &&
         ((arena_00 == (arena_t *)0x0 ||
          (iVar18 = extent_snad_comp((extent_t *)paVar9,(extent_t *)arena_00),
          paVar15 = extraout_RDX_03, iVar18 < 0)))) {
        arena_00 = paVar9;
      }
      if ((int)uVar8 == 199) break;
      uVar8 = bitmap_ffu(bitmap,(bitmap_info_t *)(uVar20 + 1),(size_t)paVar15);
      paVar15 = extraout_RDX_04;
    }
    if ((0x1000 < alignment) && (arena_00 == (arena_t *)0x0)) {
      sVar7 = extent_size_quantize_ceil((size_t)paVar2);
      if (sVar7 < 0x7000000000000001) {
        uVar8 = sVar7 * 2 - 1;
        lVar3 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar11 = (uint)lVar3;
        iVar18 = uVar11 - 0xe;
        if (uVar11 < 0xe) {
          iVar18 = 0;
        }
        bVar10 = (char)lVar3 - 3;
        if (uVar11 < 0xf) {
          bVar10 = 0xc;
        }
        pbVar17 = (bitmap_info_t *)
                  (ulong)(((uint)(((sVar7 - 1 >> (bVar10 & 0x3f)) << (bVar10 & 0x3f)) >>
                                 (bVar10 & 0x3f)) & 3) + iVar18 * 4);
      }
      else {
        pbVar17 = (bitmap_info_t *)0xc7;
      }
      sVar7 = extent_size_quantize_ceil((size_t)paVar6);
      if (sVar7 < 0x7000000000000001) {
        uVar8 = sVar7 * 2 - 1;
        lVar3 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        sVar14 = 0;
        uVar11 = (uint)lVar3;
        iVar18 = uVar11 - 0xe;
        if (uVar11 < 0xe) {
          iVar18 = 0;
        }
        bVar10 = (char)lVar3 - 3;
        if (uVar11 < 0xf) {
          bVar10 = 0xc;
        }
        uVar11 = ((uint)(((sVar7 - 1 >> (bVar10 & 0x3f)) << (bVar10 & 0x3f)) >> (bVar10 & 0x3f)) & 3
                 ) + iVar18 * 4;
      }
      else {
        uVar11 = 199;
        sVar14 = extraout_RDX_05;
      }
      uVar8 = bitmap_ffu(bitmap,pbVar17,sVar14);
      paVar6 = (arena_t *)0x0;
      for (; paVar9 = paVar16, (uint)uVar8 < uVar11;
          uVar8 = bitmap_ffu(bitmap,(bitmap_info_t *)((uVar8 & 0xffffffff) + 1),(size_t)paVar15)) {
        arena_00 = (arena_t *)extent_heap_first(extents->heaps + (uVar8 & 0xffffffff));
        paVar15 = (arena_t *)((ulong)*(void **)&arena_00->binshard_next & 0xfffffffffffff000);
        paVar12 = (arena_t *)((long)paVar15->nthreads + (uVar19 - 1) & -uVar19);
        if (((paVar15 <= paVar12) &&
            (paVar9 = (arena_t *)
                      ((long)&((malloc_mutex_t *)paVar15->nthreads)->field_0 +
                      (((anon_union_8_2_694bb3b2_for_extent_s_2 *)&arena_00->last_thd)->e_size_esn &
                      0xfffffffffffff000)), paVar12 < paVar9)) &&
           (paVar2 <= (arena_t *)((long)paVar9 - (long)paVar12))) goto LAB_0012289e;
      }
      goto LAB_00122b1b;
    }
LAB_0012288b:
    if (arena_00 != (arena_t *)0x0) {
LAB_0012289e:
      paVar9 = paVar16;
      extent_activate_locked((tsdn_t *)paVar16,arena_00,(extents_t *)paVar15,(extent_t *)paVar12);
      paVar6 = arena_00;
      goto LAB_00122b1b;
    }
  }
  else {
    prVar13 = prStack_208;
    paVar6 = (arena_t *)extent_lock_from_addr(tsdn,prStack_208,new_addr,false);
    paVar16 = (arena_t *)extents;
    if (paVar6 != (arena_t *)0x0) {
      paVar12 = (arena_t *)arenas[(uint)*(uint64_t *)&paVar6->nthreads[0].repr & 0xfff].repr;
      if (((paVar12 != arena) ||
          (paVar12 = (arena_t *)
                     (((anon_union_8_2_694bb3b2_for_extent_s_2 *)&paVar6->last_thd)->e_size_esn &
                     0xfffffffffffff000), paVar12 < paVar2)) ||
         (uVar11 = *(ushort *)((long)&paVar6->nthreads[0].repr + 2) & 3,
         paVar12 = (arena_t *)(ulong)uVar11, arena_00 = paVar6,
         uVar11 != (uint)(((arena_t *)extents)->stats).lstats[0x57].nfills.repr)) {
        arena_00 = (arena_t *)0x0;
      }
      extent_unlock((tsdn_t *)paVar6,(extent_t *)prVar13);
      paVar15 = extraout_RDX;
      paVar16 = (arena_t *)extents;
      goto LAB_0012288b;
    }
  }
  paVar6 = (arena_t *)0x0;
  paVar9 = paVar16;
LAB_00122b1b:
  *(undefined1 *)&(paVar16->stats).internal.repr = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&(paVar16->stats).decay_dirty.purged);
  if (paVar6 != (arena_t *)0x0) {
    lead = &peStack_1c0;
    prVar13 = prStack_208;
    paStack_1b8 = paVar6;
    eVar5 = extent_split_interior
                      (tsdn,arena,r_extent_hooks,prStack_208,(extent_t **)&paStack_1b8,
                       (extent_t **)lead,(extent_t **)&peStack_1c8,&peStack_1d0,&peStack_1d8,
                       (void *)size,pad,alignment,(ulong)slab,SUB41(szind,0),
                       in_stack_fffffffffffffdd8,SUB81(paVar9,0));
    growing_retained_00 = (undefined1)in_stack_fffffffffffffdd8;
    growing_retained = SUB81(lead,0);
    if (eVar5 == extent_split_interior_ok) {
      paVar12 = paVar9;
      if (peStack_1c0 != (extents_t *)0x0) {
        extent_deactivate(tsdn,paVar9,peStack_1c0,(extent_t *)prVar13);
      }
      if (peStack_1c8 != (extents_t *)0x0) {
        extent_deactivate(tsdn,paVar9,peStack_1c8,(extent_t *)prVar13);
      }
      paVar2 = paStack_1b8;
      if (paStack_1b8 != (arena_t *)0x0) {
        uVar11 = (uint)*(undefined8 *)paStack_1b8->nthreads;
        if (((uVar11 >> 0xd & 1) == 0 & *commit) == 1) {
          uVar19 = (ulong)paStack_1b8->last_thd & 0xfffffffffffff000;
          _Var4 = extent_commit_impl(tsdn,arena,r_extent_hooks,(extent_t *)paStack_1b8,0,uVar19,
                                     (_Bool)growing_retained_00);
          if (_Var4) {
            extent_record(tsdn,arena,r_extent_hooks,(extents_t *)paVar12,(extent_t *)paVar2,
                          SUB81(uVar19,0));
            return (extent_t *)0x0;
          }
          _Var4 = extent_need_manual_zero(arena);
          uVar19 = *(ulong *)paVar2->nthreads;
          if (!_Var4) {
            uVar19 = uVar19 | 0x8000;
            *(ulong *)paVar2->nthreads = uVar19;
          }
          uVar11 = (uint)uVar19;
        }
        if ((uVar11 >> 0xd & 1) != 0) {
          *commit = true;
        }
        if ((short)uVar11 < 0) {
          *zero = true;
        }
        if (pad != 0) {
          extent_addr_randomize(tsdn,(extent_t *)paVar2,alignment);
        }
        if (slab) {
          pbVar1 = (byte *)((long)&paVar2->nthreads[0].repr + 1);
          *pbVar1 = *pbVar1 | 0x10;
          extent_interior_register(tsdn,prStack_208,(extent_t *)paVar2,szind);
        }
        if (*zero != true) {
          return (extent_t *)paVar2;
        }
        if ((paVar2->nthreads[0].repr & 0x8000) != 0) {
          return (extent_t *)paVar2;
        }
        addr = (void *)(*(ulong *)&paVar2->binshard_next & 0xfffffffffffff000);
        uVar19 = (ulong)paVar2->last_thd & 0xfffffffffffff000;
        _Var4 = extent_need_manual_zero(arena);
        if ((!_Var4) && (_Var4 = pages_purge_forced(addr,uVar19), !_Var4)) {
          return (extent_t *)paVar2;
        }
        memset(addr,0,uVar19);
        return (extent_t *)paVar2;
      }
    }
    else {
      if (peStack_1d8 != (extent_t *)0x0) {
        extent_deregister(tsdn,peStack_1d8);
      }
      if (peStack_1d0 != (extent_t *)0x0) {
        extent_deregister_no_gdump_sub(tsdn,peStack_1d0);
        extents_leak(tsdn,arena,r_extent_hooks,(extents_t *)paVar9,peStack_1d0,
                     (_Bool)growing_retained);
      }
    }
  }
  return (extent_t *)0x0;
}

Assistant:

extent_t *
extents_alloc(tsdn_t *tsdn, arena_t *arena, extent_hooks_t **r_extent_hooks,
    extents_t *extents, void *new_addr, size_t size, size_t pad,
    size_t alignment, bool slab, szind_t szind, bool *zero, bool *commit) {
	assert(size + pad != 0);
	assert(alignment != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extent_t *extent = extent_recycle(tsdn, arena, r_extent_hooks, extents,
	    new_addr, size, pad, alignment, slab, szind, zero, commit, false);
	assert(extent == NULL || extent_dumpable_get(extent));
	return extent;
}